

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_operator.cpp
# Opt level: O2

void __thiscall
duckdb::ExpressionExecutor::Execute
          (ExpressionExecutor *this,BoundOperatorExpression *expr,ExpressionState *state,
          SelectionVector *sel,idx_t count,Vector *result)

{
  ExpressionType EVar1;
  uint count_00;
  const_reference pvVar2;
  pointer pEVar3;
  type pEVar4;
  reference pvVar5;
  Vector *pVVar6;
  type state_00;
  reference result_00;
  InvalidInputException *this_00;
  NotImplementedException *pNVar7;
  idx_t count_01;
  Vector *pVVar8;
  size_type __n;
  idx_t iVar9;
  idx_t iVar10;
  idx_t iVar11;
  unsigned_long count_02;
  Vector *sel_00;
  idx_t i_1;
  ulong __n_00;
  idx_t iVar12;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *this_01;
  Vector left;
  Vector intermediate;
  LogicalType local_250;
  Vector comp_res;
  Value false_val;
  LogicalType local_190;
  LogicalType local_178;
  LogicalType local_160;
  Vector vector_to_check;
  LogicalType local_c8;
  LogicalType local_b0;
  Vector new_result;
  
  EVar1 = (expr->super_Expression).super_BaseExpression.type;
  if ((byte)(EVar1 - COMPARE_IN) < 2) {
    if ((ulong)((long)(expr->children).
                      super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(expr->children).
                     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 9) {
      this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&left,"IN needs at least two children",(allocator *)&intermediate);
      InvalidInputException::InvalidInputException(this_00,(string *)&left);
      __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    this_01 = &expr->children;
    pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(this_01,0);
    pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar2);
    LogicalType::LogicalType(&local_160,&pEVar3->return_type);
    Vector::Vector(&left,&local_160,0x800);
    LogicalType::~LogicalType(&local_160);
    pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(this_01,0);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(pvVar2);
    pvVar5 = vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
             ::get<true>(&state->child_states,0);
    Execute(this,pEVar4,
            (pvVar5->
            super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
            .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl,sel,count,&left);
    LogicalType::LogicalType(&local_250,BOOLEAN);
    Vector::Vector(&intermediate,&local_250,0x800);
    LogicalType::~LogicalType(&local_250);
    Value::BOOLEAN(&false_val,false);
    Vector::Reference(&intermediate,&false_val);
    for (__n_00 = 1;
        __n_00 < (ulong)((long)(expr->children).
                               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(expr->children).
                               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3); __n_00 = __n_00 + 1)
    {
      pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(this_01,__n_00);
      pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar2);
      LogicalType::LogicalType(&local_178,&pEVar3->return_type);
      Vector::Vector(&vector_to_check,&local_178,0x800);
      LogicalType::~LogicalType(&local_178);
      LogicalType::LogicalType(&local_b0,BOOLEAN);
      Vector::Vector(&comp_res,&local_b0,0x800);
      LogicalType::~LogicalType(&local_b0);
      pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(this_01,__n_00);
      pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(pvVar2);
      pvVar5 = vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
               ::get<true>(&state->child_states,__n_00);
      Execute(this,pEVar4,
              (pvVar5->
              super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
              )._M_t.
              super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
              .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl,sel,count,
              &vector_to_check);
      VectorOperations::Equals(&left,&vector_to_check,&comp_res,count);
      if (__n_00 == 1) {
        Vector::Reference(&intermediate,&comp_res);
      }
      else {
        LogicalType::LogicalType(&local_c8,BOOLEAN);
        Vector::Vector(&new_result,&local_c8,true,false,0x800);
        LogicalType::~LogicalType(&local_c8);
        VectorOperations::Or(&intermediate,&comp_res,&new_result,count);
        Vector::Reference(&intermediate,&new_result);
        Vector::~Vector(&new_result);
      }
      Vector::~Vector(&comp_res);
      Vector::~Vector(&vector_to_check);
    }
    if (EVar1 == COMPARE_NOT_IN) {
      VectorOperations::Not(&intermediate,result,count);
    }
    else {
      Vector::Reference(result,&intermediate);
    }
    Value::~Value(&false_val);
    Vector::~Vector(&intermediate);
    Vector::~Vector(&left);
  }
  else if (EVar1 == OPERATOR_TRY) {
    pvVar5 = vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
             ::get<true>(&state->child_states,0);
    state_00 = unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>
               ::operator*(pvVar5);
    pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::get<true>(&expr->children,0);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator*(pvVar2);
    Execute(this,pEVar4,state_00,sel,count,result);
  }
  else {
    if (EVar1 != OPERATOR_COALESCE) {
      if ((long)(expr->children).
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(expr->children).
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 8) {
        pNVar7 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string((string *)&left,"operator",(allocator *)&intermediate);
        NotImplementedException::NotImplementedException(pNVar7,(string *)&left);
        __cxa_throw(pNVar7,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
      }
      DataChunk::Reset(&state->intermediate_chunk);
      result_00 = vector<duckdb::Vector,_true>::get<true>(&(state->intermediate_chunk).data,0);
      pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(&expr->children,0);
      pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(pvVar2);
      pvVar5 = vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
               ::get<true>(&state->child_states,0);
      Execute(this,pEVar4,
              (pvVar5->
              super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
              )._M_t.
              super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
              .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl,sel,count,
              result_00);
      EVar1 = (expr->super_Expression).super_BaseExpression.type;
      if (EVar1 == OPERATOR_IS_NOT_NULL) {
        VectorOperations::IsNotNull(result_00,result,count);
        return;
      }
      if (EVar1 == OPERATOR_IS_NULL) {
        VectorOperations::IsNull(result_00,result,count);
        return;
      }
      if (EVar1 == OPERATOR_NOT) {
        VectorOperations::Not(result_00,result,count);
        return;
      }
      pNVar7 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&left,"Unsupported operator type with 1 child!",
                 (allocator *)&intermediate);
      NotImplementedException::NotImplementedException(pNVar7,(string *)&left);
      __cxa_throw(pNVar7,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    SelectionVector::SelectionVector((SelectionVector *)&vector_to_check,count);
    SelectionVector::SelectionVector((SelectionVector *)&comp_res,count);
    SelectionVector::SelectionVector((SelectionVector *)&new_result,count);
    SelectionVector::SelectionVector((SelectionVector *)&false_val,count);
    count_01 = count;
    pVVar6 = &vector_to_check;
    sel_00 = (Vector *)sel;
    for (__n = 0; pVVar8 = pVVar6,
        __n < (ulong)((long)(expr->children).
                            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(expr->children).
                            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                            .
                            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1) {
      pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(&expr->children,__n);
      pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar2);
      LogicalType::LogicalType(&local_190,&pEVar3->return_type);
      Vector::Vector(&left,&local_190,0x800);
      LogicalType::~LogicalType(&local_190);
      pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::get<true>(&expr->children,__n);
      pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(pvVar2);
      pvVar5 = vector<duckdb::unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>,_true>
               ::get<true>(&state->child_states,__n);
      Execute(this,pEVar4,
              (pvVar5->
              super_unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
              )._M_t.
              super___uniq_ptr_impl<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::ExpressionState_*,_std::default_delete<duckdb::ExpressionState>_>
              .super__Head_base<0UL,_duckdb::ExpressionState_*,_false>._M_head_impl,
              (SelectionVector *)sel_00,count_01,&left);
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&intermediate);
      Vector::ToUnifiedFormat(&left,count_01,(UnifiedVectorFormat *)&intermediate);
      count_02 = 0;
      iVar12 = 0;
      for (iVar9 = 0; count_01 != iVar9; iVar9 = iVar9 + 1) {
        iVar10 = iVar9;
        if ((sel_00 != (Vector *)0x0) && (*(long *)sel_00 != 0)) {
          iVar10 = (idx_t)*(uint *)(*(long *)sel_00 + iVar9 * 4);
        }
        iVar11 = iVar9;
        if (*(long *)intermediate._0_8_ != 0) {
          iVar11 = (idx_t)*(uint *)(*(long *)intermediate._0_8_ + iVar9 * 4);
        }
        if ((intermediate.type.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
             (element_type *)0x0) ||
           (((ulong)(&(intermediate.type.type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->_vptr_ExtraTypeInfo)[iVar11 >> 6] >> (iVar11 & 0x3f) & 1) != 0)) {
          *(int *)(new_result._0_8_ + count_02 * 4) = (int)iVar9;
          *(int *)(false_val.type_._0_8_ + count_02 * 4) = (int)iVar10;
          count_02 = count_02 + 1;
        }
        else {
          *(int *)(*(long *)pVVar8 + iVar12 * 4) = (int)iVar10;
          iVar12 = iVar12 + 1;
        }
      }
      if (count_02 != 0) {
        Vector::Slice(&left,(SelectionVector *)&new_result,count_02);
        count_00 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert(count_02);
        FillSwitch(this,&left,result,(SelectionVector *)&false_val,count_00);
      }
      UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&intermediate);
      Vector::~Vector(&left);
      if (iVar12 == 0) goto LAB_00366abd;
      pVVar6 = &vector_to_check;
      if (pVVar8 == &vector_to_check) {
        pVVar6 = &comp_res;
      }
      count_01 = iVar12;
      sel_00 = pVVar8;
    }
    if (count_01 != 0) {
      for (iVar9 = 0; count_01 != iVar9; iVar9 = iVar9 + 1) {
        iVar12 = iVar9;
        if (*(long *)sel_00 != 0) {
          iVar12 = (idx_t)*(uint *)(*(long *)sel_00 + iVar9 * 4);
        }
        FlatVector::SetNull(result,iVar12,true);
      }
    }
LAB_00366abd:
    if (sel == (SelectionVector *)0x0) {
      if (count == 1) {
        Vector::SetVectorType(result,CONSTANT_VECTOR);
      }
    }
    else {
      Vector::Slice(result,sel,count);
    }
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&false_val.type_.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&new_result.type.type_info_);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&comp_res.type.type_info_);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&vector_to_check.type.type_info_);
  }
  return;
}

Assistant:

void ExpressionExecutor::Execute(const BoundOperatorExpression &expr, ExpressionState *state,
                                 const SelectionVector *sel, idx_t count, Vector &result) {
	// special handling for special snowflake 'IN'
	// IN has n children
	auto expression_type = expr.GetExpressionType();
	if (expression_type == ExpressionType::COMPARE_IN || expression_type == ExpressionType::COMPARE_NOT_IN) {
		if (expr.children.size() < 2) {
			throw InvalidInputException("IN needs at least two children");
		}

		Vector left(expr.children[0]->return_type);
		// eval left side
		Execute(*expr.children[0], state->child_states[0].get(), sel, count, left);

		// init result to false
		Vector intermediate(LogicalType::BOOLEAN);
		Value false_val = Value::BOOLEAN(false);
		intermediate.Reference(false_val);

		// in rhs is a list of constants
		// for every child, OR the result of the comparison with the left
		// to get the overall result.
		for (idx_t child = 1; child < expr.children.size(); child++) {
			Vector vector_to_check(expr.children[child]->return_type);
			Vector comp_res(LogicalType::BOOLEAN);

			Execute(*expr.children[child], state->child_states[child].get(), sel, count, vector_to_check);
			VectorOperations::Equals(left, vector_to_check, comp_res, count);

			if (child == 1) {
				// first child: move to result
				intermediate.Reference(comp_res);
			} else {
				// otherwise OR together
				Vector new_result(LogicalType::BOOLEAN, true, false);
				VectorOperations::Or(intermediate, comp_res, new_result, count);
				intermediate.Reference(new_result);
			}
		}
		if (expression_type == ExpressionType::COMPARE_NOT_IN) {
			// NOT IN: invert result
			VectorOperations::Not(intermediate, result, count);
		} else {
			// directly use the result
			result.Reference(intermediate);
		}
	} else if (expression_type == ExpressionType::OPERATOR_COALESCE) {
		SelectionVector sel_a(count);
		SelectionVector sel_b(count);
		SelectionVector slice_sel(count);
		SelectionVector result_sel(count);
		SelectionVector *next_sel = &sel_a;
		const SelectionVector *current_sel = sel;
		idx_t remaining_count = count;
		idx_t next_count;
		for (idx_t child = 0; child < expr.children.size(); child++) {
			Vector vector_to_check(expr.children[child]->return_type);
			Execute(*expr.children[child], state->child_states[child].get(), current_sel, remaining_count,
			        vector_to_check);

			UnifiedVectorFormat vdata;
			vector_to_check.ToUnifiedFormat(remaining_count, vdata);

			idx_t result_count = 0;
			next_count = 0;
			for (idx_t i = 0; i < remaining_count; i++) {
				auto base_idx = current_sel ? current_sel->get_index(i) : i;
				auto idx = vdata.sel->get_index(i);
				if (vdata.validity.RowIsValid(idx)) {
					slice_sel.set_index(result_count, i);
					result_sel.set_index(result_count++, base_idx);
				} else {
					next_sel->set_index(next_count++, base_idx);
				}
			}
			if (result_count > 0) {
				vector_to_check.Slice(slice_sel, result_count);
				FillSwitch(vector_to_check, result, result_sel, NumericCast<sel_t>(result_count));
			}
			current_sel = next_sel;
			next_sel = next_sel == &sel_a ? &sel_b : &sel_a;
			remaining_count = next_count;
			if (next_count == 0) {
				break;
			}
		}
		if (remaining_count > 0) {
			for (idx_t i = 0; i < remaining_count; i++) {
				FlatVector::SetNull(result, current_sel->get_index(i), true);
			}
		}
		if (sel) {
			result.Slice(*sel, count);
		} else if (count == 1) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
		}
	} else if (expression_type == ExpressionType::OPERATOR_TRY) {
		auto &child_state = *state->child_states[0];
		try {
			Execute(*expr.children[0], &child_state, sel, count, result);
			return;
		} catch (std::exception &ex) {
			ErrorData error(ex);
			auto error_type = error.Type();
			if (!Exception::IsExecutionError(error_type)) {
				throw;
			}
		}
		SelectionVector selvec(1);
		DataChunk intermediate;
		intermediate.Initialize(GetAllocator(), {result.GetType()}, 1);
		for (idx_t i = 0; i < count; i++) {
			intermediate.Reset();
			intermediate.SetCardinality(1);
			selvec.set_index(0, sel ? sel->get_index(i) : i);
			Value val(result.GetType());
			try {
				Execute(*expr.children[0], &child_state, &selvec, 1, intermediate.data[0]);
				val = intermediate.GetValue(0, 0);
			} catch (std::exception &ex) {
				ErrorData error(ex);
				auto error_type = error.Type();
				if (!Exception::IsExecutionError(error_type)) {
					throw;
				}
			}
			result.SetValue(i, val);
		}
		if (count == 1) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
		}
	} else if (expr.children.size() == 1) {
		state->intermediate_chunk.Reset();
		auto &child = state->intermediate_chunk.data[0];

		Execute(*expr.children[0], state->child_states[0].get(), sel, count, child);
		switch (expr.GetExpressionType()) {
		case ExpressionType::OPERATOR_NOT: {
			VectorOperations::Not(child, result, count);
			break;
		}
		case ExpressionType::OPERATOR_IS_NULL: {
			VectorOperations::IsNull(child, result, count);
			break;
		}
		case ExpressionType::OPERATOR_IS_NOT_NULL: {
			VectorOperations::IsNotNull(child, result, count);
			break;
		}
		default:
			throw NotImplementedException("Unsupported operator type with 1 child!");
		}
	} else {
		throw NotImplementedException("operator");
	}
}